

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshtmat.cpp
# Opt level: O0

TPZGenAMatrix<long> * __thiscall
TPZGenAMatrix<long>::operator+=(TPZGenAMatrix<long> *this,TPZGenAMatrix<long> *rval)

{
  long *plVar1;
  undefined8 *in_RSI;
  TPZGenAMatrix<long> *in_RDI;
  long *pbeg3;
  long *pfin;
  long *pbeg1;
  long *local_28;
  long *local_18;
  
  if (((in_RDI->super_TPZGenMatrix<long>).fRows != in_RSI[1]) ||
     ((in_RDI->super_TPZGenMatrix<long>).fCols != in_RSI[2])) {
    std::operator<<((ostream *)&std::cout,"ERROR-> different TPZGenMatrix<TObj> size for addition");
  }
  std::ostream::flush();
  local_18 = (in_RDI->super_TPZGenMatrix<long>).fMem;
  local_28 = (long *)*in_RSI;
  plVar1 = local_18 +
           (in_RDI->super_TPZGenMatrix<long>).fRows * (in_RDI->super_TPZGenMatrix<long>).fCols;
  for (; local_18 < plVar1; local_18 = local_18 + 1) {
    *local_18 = *local_28 + *local_18;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZGenAMatrix<TObj>& TPZGenAMatrix<TObj>::operator+=(const TPZGenAMatrix<TObj> & rval) {
	
	if ( (this->fRows != rval.fRows) || (this->fCols != rval.fCols) )
		cout << "ERROR-> different TPZGenMatrix<TObj> size for addition";
	cout.flush();
	
	TObj *pbeg1 = this->fMem, *pfin;
	TObj *pbeg3 = rval.fMem;
	pfin = pbeg1 + (this->fRows*this->fCols);
	for ( ; pbeg1<pfin; pbeg1++, pbeg3++)
		*pbeg1 += *pbeg3;
	return (*this);
}